

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  ostream *poVar1;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  string local_348;
  string local_328;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  undefined1 local_278 [8];
  string tmp;
  string local_238;
  string local_218 [32];
  string local_1f8 [48];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [376];
  App *local_20;
  App *sub_local;
  Formatter *this_local;
  
  local_20 = sub;
  sub_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  App::get_display_name_abi_cxx11_(&local_1c8,local_20);
  poVar1 = ::std::operator<<(local_198,(string *)&local_1c8);
  ::std::operator<<(poVar1,"\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(local_1f8,this,local_20);
  ::std::operator<<(local_198,local_1f8);
  ::std::__cxx11::string::~string(local_1f8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(local_218,this,local_20);
  ::std::operator<<(local_198,local_218);
  ::std::__cxx11::string::~string(local_218);
  make_groups_abi_cxx11_(&local_238,this,local_20,Sub);
  ::std::operator<<(local_198,(string *)&local_238);
  ::std::__cxx11::string::~string((string *)&local_238);
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])
            ((undefined1 *)((long)&tmp.field_2 + 8),this,local_20,2);
  ::std::operator<<(local_198,(string *)(tmp.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
  ::std::__cxx11::stringstream::str();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2b8,"\n\n",&local_2b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2e0,"\n",&local_2e1);
  detail::find_and_replace((string *)local_278,&local_298,&local_2b8,&local_2e0);
  ::std::__cxx11::string::~string((string *)&local_2e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  ::std::__cxx11::string::~string((string *)&local_2b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::substr((ulong)local_308,(ulong)local_278);
  ::std::__cxx11::string::operator=((string *)local_278,local_308);
  ::std::__cxx11::string::~string(local_308);
  ::std::__cxx11::string::string((string *)&local_348,(string *)local_278);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_368,"\n",&local_369);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_390,"\n  ",&local_391);
  detail::find_and_replace(&local_328,&local_348,&local_368,&local_390);
  ::std::operator+(__return_storage_ptr__,&local_328,"\n");
  ::std::__cxx11::string::~string((string *)&local_328);
  ::std::__cxx11::string::~string((string *)&local_390);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
  ::std::__cxx11::string::~string((string *)&local_368);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
  ::std::__cxx11::string::~string((string *)&local_348);
  ::std::__cxx11::string::~string((string *)local_278);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name() << "\n";

    out << make_description(sub);
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1); // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}